

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

void __thiscall
soul::FunctionBuilder::beginBlock(FunctionBuilder *this,pool_ptr<soul::heart::Block> *b)

{
  pool_ptr<soul::heart::Block> *this_00;
  Block *pBVar1;
  Block *pBVar2;
  Function *pFVar3;
  Iterator IVar4;
  pool_ref<soul::heart::Block> local_38;
  pool_ptr<soul::heart::Block> local_30;
  
  if ((this->currentFunction).object == (Function *)0x0) {
    throwInternalCompilerError("currentFunction != nullptr","beginBlock",0x1eb);
  }
  pBVar2 = b->object;
  pBVar1 = (this->super_BlockBuilder).currentBlock.object;
  if (pBVar1 != pBVar2) {
    this_00 = &(this->super_BlockBuilder).currentBlock;
    if (pBVar1 != (Block *)0x0 && pBVar2 != (Block *)0x0) {
      pBVar2 = pool_ptr<soul::heart::Block>::operator->(this_00);
      if ((pBVar2->terminator).object == (Terminator *)0x0) {
        pBVar2 = pool_ptr<soul::heart::Block>::operator*(b);
        local_30 = (pool_ptr<soul::heart::Block>)b->object;
        addBranch(this,pBVar2,&local_30);
        return;
      }
      pBVar2 = b->object;
    }
    this_00->object = pBVar2;
    if (b->object != (Block *)0x0) {
      pFVar3 = pool_ptr<soul::heart::Function>::operator*(&this->currentFunction);
      pBVar2 = pool_ptr<soul::heart::Block>::operator->(b);
      heart::Utilities::findBlock<soul::Identifier>((Utilities *)&local_38,pFVar3,&pBVar2->name);
      if (local_38.object != (Block *)0x0) {
        throwInternalCompilerError
                  ("heart::Utilities::findBlock (*currentFunction, b->name) == nullptr","beginBlock"
                   ,0x1f5);
      }
      pFVar3 = pool_ptr<soul::heart::Function>::operator->(&this->currentFunction);
      local_38.object = pool_ptr<soul::heart::Block>::operator*(b);
      std::
      vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
      ::emplace_back<soul::pool_ref<soul::heart::Block>>
                ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
                  *)&pFVar3->blocks,&local_38);
      pBVar2 = pool_ptr<soul::heart::Block>::operator->(b);
      IVar4 = LinkedList<soul::heart::Statement>::getLast(&pBVar2->statements);
      (this->super_BlockBuilder).lastStatementInCurrentBlock.object = IVar4.object;
    }
    return;
  }
  throwInternalCompilerError("currentBlock != b","beginBlock",0x1ec);
}

Assistant:

heart::Variable& createRegisterVariable (heart::Expression& value)
    {
        auto& v = createRegisterVariable (value.getType());
        addAssignment (v, value);
        return v;
    }